

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j1939acd.c
# Opt level: O1

int open_socket(char *device,uint64_t name)

{
  int __fd;
  int iVar1;
  char *pcVar2;
  int value;
  sockaddr_can saddr;
  undefined4 local_24;
  sockaddr local_20;
  undefined4 local_10;
  undefined1 local_c;
  
  local_20.sa_family = 0x1d;
  local_20.sa_data._2_4_ = if_nametoindex(device);
  local_10 = 0x40000;
  local_c = 0xfe;
  local_20.sa_data._6_8_ = name;
  if (s.verbose != 0) {
    open_socket_cold_1();
  }
  __fd = socket(0x1d,2,7);
  if (__fd < 0) {
    pcVar2 = "socket(j1939)";
  }
  else {
    if (s.verbose != 0) {
      open_socket_cold_2();
    }
    iVar1 = setsockopt(__fd,0x6b,1,filt,0x60);
    if (iVar1 < 0) {
      pcVar2 = "setsockopt filter";
    }
    else {
      local_24 = 1;
      if (s.verbose != 0) {
        open_socket_cold_3();
      }
      iVar1 = setsockopt(__fd,1,6,&local_24,4);
      if (iVar1 < 0) {
        pcVar2 = "setsockopt set broadcast";
      }
      else {
        if (s.verbose != 0) {
          open_socket_cold_4();
        }
        iVar1 = bind(__fd,&local_20,0x18);
        if (-1 < iVar1) {
          return __fd;
        }
        pcVar2 = "bind()";
      }
    }
  }
  err(1,pcVar2);
}

Assistant:

static int open_socket(const char *device, uint64_t name)
{
	int ret, sock;
	int value;
	struct sockaddr_can saddr = {
		.can_family = AF_CAN,
		.can_addr.j1939 = {
			.name = name,
			.addr = J1939_IDLE_ADDR,
			.pgn = J1939_NO_PGN,
		},
		.can_ifindex = if_nametoindex(device),
	};

	if (s.verbose)
		fprintf(stderr, "- socket(PF_CAN, SOCK_DGRAM, CAN_J1939);\n");
	sock = ret = socket(PF_CAN, SOCK_DGRAM, CAN_J1939);
	if (ret < 0)
		err(1, "socket(j1939)");

	if (s.verbose)
		fprintf(stderr, "- setsockopt(, SOL_CAN_J1939, SO_J1939_FILTER, <filter>, %zd);\n", sizeof(filt));
	ret = setsockopt(sock, SOL_CAN_J1939, SO_J1939_FILTER,
			&filt, sizeof(filt));
	if (ret < 0)
		err(1, "setsockopt filter");

	value = 1;
	if (s.verbose)
		fprintf(stderr, "- setsockopt(, SOL_SOCKET, SO_BROADCAST, %d, %zd);\n", value, sizeof(value));
	ret = setsockopt(sock, SOL_SOCKET, SO_BROADCAST,
			&value, sizeof(value));
	if (ret < 0)
		err(1, "setsockopt set broadcast");

	if (s.verbose)
		fprintf(stderr, "- bind(, %s, %zi);\n", libj1939_addr2str(&saddr), sizeof(saddr));
	ret = bind(sock, (void *)&saddr, sizeof(saddr));
	if (ret < 0)
		err(1, "bind()");
	return sock;
}